

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRailing::~IfcRailing(IfcRailing *this)

{
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  plVar1 = (long *)(&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>).field_0x20
                   + lVar2);
  plVar1[-0x2d] = 0x85fe28;
  plVar1[3] = 0x85ff40;
  plVar1[-0x1c] = 0x85fe50;
  plVar1[-0x1a] = 0x85fe78;
  plVar1[-0x13] = 0x85fea0;
  plVar1[-0xd] = 0x85fec8;
  plVar1[-6] = 0x85fef0;
  plVar1[-4] = 0x85ff18;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcElement::~IfcElement
            ((IfcElement *)(&this->field_0x0 + lVar2),&PTR_construction_vtable_24__0085ff60);
  operator_delete((IfcElement *)(&this->field_0x0 + lVar2),0x198);
  return;
}

Assistant:

IfcRailing() : Object("IfcRailing") {}